

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O3

void __thiscall
OSTEI_HRR_Algorithm_Base::HRRDoubletLoop_
          (OSTEI_HRR_Algorithm_Base *this,HRRDoubletStepList *hrrlist,DoubletSet *inittargets,
          DoubletSet *solveddoublets,DoubletSet *pruned,RRStepType steptype)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  long lVar3;
  const_iterator cVar4;
  _Rb_tree_node_base *p_Var5;
  DoubletSet newtargets;
  DoubletSet targets;
  HRRDoubletStep hrr;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_160;
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  local_130;
  value_type local_100;
  
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::_Rb_tree(&local_130,&inittargets->_M_t);
  if (local_130._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = &(solveddoublets->_M_t)._M_impl.super__Rb_tree_header;
    do {
      local_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_160._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_160._M_impl.super__Rb_tree_header._M_header;
      local_160._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_160._M_impl.super__Rb_tree_header._M_header._M_right =
           local_160._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var5 = &local_130._M_impl.super__Rb_tree_header._M_header;
          p_Var5 != local_130._M_impl.super__Rb_tree_header._M_header._M_left;
          p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_decrement(p_Var5)) {
        lVar3 = std::_Rb_tree_decrement(p_Var5);
        cVar4 = std::
                _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
                ::find(&solveddoublets->_M_t,(key_type *)(lVar3 + 0x20));
        if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
          lVar3 = std::_Rb_tree_decrement(p_Var5);
          (*this->_vptr_OSTEI_HRR_Algorithm_Base[2])(&local_100,this,lVar3 + 0x20);
          std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::push_back
                    (hrrlist,&local_100);
          cVar4 = std::
                  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
                  ::find(&solveddoublets->_M_t,local_100.src._M_elems);
          if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
            std::
            _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
            ::_M_insert_unique<Doublet_const&>
                      ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                        *)&local_160,local_100.src._M_elems);
          }
          cVar4 = std::
                  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
                  ::find(&solveddoublets->_M_t,local_100.src._M_elems + 1);
          if ((_Rb_tree_header *)cVar4._M_node == p_Var1) {
            std::
            _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
            ::_M_insert_unique<Doublet_const&>
                      ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                        *)&local_160,local_100.src._M_elems + 1);
          }
          lVar3 = std::_Rb_tree_decrement(p_Var5);
          std::
          _Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
          ::_M_insert_unique<Doublet_const&>
                    ((_Rb_tree<Doublet,Doublet,std::_Identity<Doublet>,std::less<Doublet>,std::allocator<Doublet>>
                      *)solveddoublets,(Doublet *)(lVar3 + 0x20));
          lVar3 = 0;
          do {
            pvVar2 = *(void **)((long)(&local_100.src._M_elems[1].right + 1) + lVar3 + 4);
            if ((void *)((long)(&local_100.src._M_elems[1].right + 2) + lVar3 + 8) != pvVar2) {
              operator_delete(pvVar2);
            }
            lVar3 = lVar3 + -0x40;
          } while (lVar3 != -0x80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100.target.tag._M_dataplus._M_p != &local_100.target.tag.field_2) {
            operator_delete(local_100.target.tag._M_dataplus._M_p);
          }
        }
      }
      PruneDoublets_((DoubletSet *)&local_160,pruned,steptype);
      std::
      _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
      ::operator=(&local_130,&local_160);
      std::
      _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
      ::~_Rb_tree(&local_160);
    } while (local_130._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  std::
  _Rb_tree<Doublet,_Doublet,_std::_Identity<Doublet>,_std::less<Doublet>,_std::allocator<Doublet>_>
  ::~_Rb_tree(&local_130);
  return;
}

Assistant:

void OSTEI_HRR_Algorithm_Base::HRRDoubletLoop_(HRRDoubletStepList & hrrlist,
                                               const DoubletSet & inittargets,
                                               DoubletSet & solveddoublets,
                                               DoubletSet & pruned,
                                               RRStepType steptype)
{
    DoubletSet targets = inittargets;

    while(targets.size())
    {
        DoubletSet newtargets;

        for(auto it = targets.rbegin(); it != targets.rend(); ++it)
        {
            // skip if done alread
            // this can happen with some of the more complex trees
            if(solveddoublets.count(*it) > 0)
                continue;

            HRRDoubletStep hrr = this->DoubletStep_(*it, steptype);
            hrrlist.push_back(hrr);

            if(solveddoublets.count(hrr.src[0]) == 0)
                newtargets.insert(hrr.src[0]);
            if(solveddoublets.count(hrr.src[1]) == 0)
                newtargets.insert(hrr.src[1]);
            
            solveddoublets.insert(*it);
        }

        //cout << "Generated " << newtargets.size() << " new targets\n";

        PruneDoublets_(newtargets, pruned, steptype);

        //cout << "After pruning: " << newtargets.size() << " new targets\n";
        //for(const auto & it : newtargets)
        //    std::cout << "    " << it << "\n";

        targets = newtargets;
    } 

}